

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_112>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_112> *this)

{
  code *local_400;
  undefined1 local_3d0 [8];
  C_A_T_C_H_T_E_S_T_112 obj;
  TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_112> *this_local;
  
  obj.super_SubcommandProgram._952_8_ = this;
  anon_unknown.dwarf_38b11::C_A_T_C_H_T_E_S_T_112::C_A_T_C_H_T_E_S_T_112
            ((C_A_T_C_H_T_E_S_T_112 *)local_3d0);
  local_400 = (code *)this->m_testAsMethod;
  if (((ulong)local_400 & 1) != 0) {
    local_400 = *(code **)(local_400 + *(long *)(local_3d0 + *(long *)&this->field_0x10) + -1);
  }
  (*local_400)(local_3d0 + *(long *)&this->field_0x10);
  anon_unknown.dwarf_38b11::C_A_T_C_H_T_E_S_T_112::~C_A_T_C_H_T_E_S_T_112
            ((C_A_T_C_H_T_E_S_T_112 *)local_3d0);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }